

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O3

void __thiscall MakefileGenerator::verifyCompilers(MakefileGenerator *this)

{
  int *piVar1;
  ProStringList *this_00;
  ProStringList *pPVar2;
  QList<ProString> *this_01;
  QList<ProString> *this_02;
  long lVar3;
  char16_t *pcVar4;
  _List_node_base *this_03;
  int idx;
  ProString *this_04;
  long in_FS_OFFSET;
  ProKey ofkey;
  ProKey okey;
  QStringBuilder<QStringBuilder<const_char_(&)[22],_ProString_&>,_const_char_(&)[2]> local_e0;
  ProString local_c8;
  undefined1 local_98 [32];
  undefined1 *local_78;
  undefined1 *puStack_70;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_03 = (this->project->super_QMakeEvaluator).m_valuemapStack.
            super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
            super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
            ._M_impl._M_node.super__List_node_base._M_next + 1;
  ProKey::ProKey((ProKey *)&local_68,"QMAKE_EXTRA_COMPILERS");
  this_00 = QMap<ProKey,_ProStringList>::operator[]
                      ((QMap<ProKey,_ProStringList> *)this_03,(ProKey *)&local_68);
  piVar1 = (int *)CONCAT44(local_68.m_string.d.d._4_4_,local_68.m_string.d.d._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_68.m_string.d.d._4_4_,local_68.m_string.d.d._0_4_),2,
                 0x10);
    }
  }
  if ((this_00->super_QList<ProString>).d.size != 0) {
    lVar3 = 0;
    idx = 0;
    do {
      this_04 = (this_00->super_QList<ProString>).d.ptr + lVar3;
      local_68.m_file = -0x55555556;
      local_68._36_4_ = 0xaaaaaaaa;
      local_68.m_hash._0_4_ = 0xaaaaaaaa;
      local_68.m_hash._4_4_ = 0xaaaaaaaa;
      local_68.m_string.d.size._0_4_ = 0xaaaaaaaa;
      local_68.m_string.d.size._4_4_ = 0xaaaaaaaa;
      local_68.m_offset = -0x55555556;
      local_68.m_length = -0x55555556;
      local_68.m_string.d.d._0_4_ = 0xaaaaaaaa;
      local_68.m_string.d.d._4_4_ = 0xaaaaaaaa;
      local_68.m_string.d.ptr._0_4_ = 0xaaaaaaaa;
      local_68.m_string.d.ptr._4_4_ = 0xaaaaaaaa;
      local_98._8_8_ = ".output";
      local_98._0_8_ = this_04;
      ProString::ProString<ProString_const&,char_const(&)[8]>
                (&local_68,(QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)local_98);
      pPVar2 = QMap<ProKey,_ProStringList>::operator[]
                         ((QMap<ProKey,_ProStringList> *)this_03,(ProKey *)&local_68);
      local_c8.m_string.d.d = (Data *)this_04;
      if ((pPVar2->super_QList<ProString>).d.size == 0) {
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_c8.m_string.d.ptr = L".output_function";
        ProString::ProString<ProString_const&,char_const(&)[17]>
                  ((ProString *)local_98,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[17]> *)&local_c8);
        pPVar2 = QMap<ProKey,_ProStringList>::operator[]
                           ((QMap<ProKey,_ProStringList> *)this_03,(ProKey *)local_98);
        lVar3 = (pPVar2->super_QList<ProString>).d.size;
        if (lVar3 == 0) {
          ProString::toLatin1((QByteArray *)&local_c8,this_04);
          pcVar4 = local_c8.m_string.d.ptr;
          if (local_c8.m_string.d.ptr == (char16_t *)0x0) {
            pcVar4 = (char16_t *)&QByteArray::_empty;
          }
          warn_msg(WarnLogic,"Compiler: %s: No output file specified",pcVar4);
          if ((ProString *)local_c8.m_string.d.d != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,1,0x10);
            }
          }
        }
        else {
          this_01 = &QMap<ProKey,_ProStringList>::operator[]
                               ((QMap<ProKey,_ProStringList> *)this_03,(ProKey *)&local_68)->
                     super_QList<ProString>;
          this_02 = &QMap<ProKey,_ProStringList>::operator[]
                               ((QMap<ProKey,_ProStringList> *)this_03,(ProKey *)local_98)->
                     super_QList<ProString>;
          local_e0.a.b = (ProString *)QList<ProString>::begin(this_02);
          local_e0.a.a = (char (*) [22])0x2ac06c;
          local_e0.b = (char (*) [2])0x2ab024;
          ProString::ProString<QStringBuilder<char_const(&)[22],ProString&>,char_const(&)[2]>
                    (&local_c8,&local_e0);
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)this_01,(this_01->d).size,&local_c8);
          QList<ProString>::end(this_01);
          if ((ProString *)local_c8.m_string.d.d != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        if ((ProString *)local_98._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_98._0_8_)->d).d =
               *(int *)&(((QString *)local_98._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_98._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
          }
        }
        if (lVar3 == 0) goto LAB_00155b75;
LAB_00155b71:
        idx = idx + 1;
      }
      else {
        local_c8.m_string.d.ptr = L".input";
        ProString::ProString<ProString_const&,char_const(&)[7]>
                  ((ProString *)local_98,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)&local_c8);
        pPVar2 = QMap<ProKey,_ProStringList>::operator[]
                           ((QMap<ProKey,_ProStringList> *)this_03,(ProKey *)local_98);
        lVar3 = (pPVar2->super_QList<ProString>).d.size;
        if ((ProString *)local_98._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_98._0_8_)->d).d =
               *(int *)&(((QString *)local_98._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_98._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
          }
        }
        if (lVar3 != 0) goto LAB_00155b71;
        ProString::toLatin1((QByteArray *)local_98,this_04);
        pcVar4 = (char16_t *)local_98._8_8_;
        if ((char16_t *)local_98._8_8_ == (char16_t *)0x0) {
          pcVar4 = (char16_t *)&QByteArray::_empty;
        }
        warn_msg(WarnLogic,"Compiler: %s: No input variable specified",pcVar4);
        if ((ProString *)local_98._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_98._0_8_)->d).d =
               *(int *)&(((QString *)local_98._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_98._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_98._0_8_,1,0x10);
          }
        }
LAB_00155b75:
        ProStringList::removeAt(this_00,idx);
      }
      piVar1 = (int *)CONCAT44(local_68.m_string.d.d._4_4_,local_68.m_string.d.d._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_68.m_string.d.d._4_4_,local_68.m_string.d.d._0_4_)
                     ,2,0x10);
        }
      }
      lVar3 = (long)idx;
    } while (lVar3 < (this_00->super_QList<ProString>).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void
MakefileGenerator::verifyCompilers()
{
    ProValueMap &v = project->variables();
    ProStringList &quc = v["QMAKE_EXTRA_COMPILERS"];
    for(int i = 0; i < quc.size(); ) {
        bool error = false;
        const ProString &comp = quc.at(i);
        const ProKey okey(comp + ".output");
        if (v[okey].isEmpty()) {
            const ProKey ofkey(comp + ".output_function");
            if (!v[ofkey].isEmpty()) {
                v[okey].append("${QMAKE_FUNC_FILE_IN_" + v[ofkey].first() + "}");
            } else {
                error = true;
                warn_msg(WarnLogic, "Compiler: %s: No output file specified", comp.toLatin1().constData());
            }
        } else if (v[ProKey(comp + ".input")].isEmpty()) {
            error = true;
            warn_msg(WarnLogic, "Compiler: %s: No input variable specified", comp.toLatin1().constData());
        }
        if(error)
            quc.removeAt(i);
        else
            ++i;
    }
}